

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_EstimateFee_PeginTx_Test::TestBody
          (ElementsTransactionApi_EstimateFee_PeginTx_Test *this)

{
  initializer_list<cfd::api::ElementsUtxoAndOption> __l;
  initializer_list<cfd::UtxoData> __l_00;
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  Amount tx_fee;
  Amount utxo_fee;
  Amount calc_fee;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  utxos_and_options;
  ElementsUtxoAndOption eutxo1;
  UtxoData utxo1;
  string pegin_tx_hex;
  undefined4 in_stack_ffffffffffffe6e8;
  undefined4 in_stack_ffffffffffffe6ec;
  undefined4 in_stack_ffffffffffffe6f0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe6f4;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffe6fc;
  ElementsUtxoAndOption *in_stack_ffffffffffffe700;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_00;
  ElementsUtxoAndOption *in_stack_ffffffffffffe708;
  ElementsUtxoAndOption *in_stack_ffffffffffffe710;
  undefined7 in_stack_ffffffffffffe718;
  undefined1 in_stack_ffffffffffffe71f;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe720;
  undefined8 in_stack_ffffffffffffe728;
  undefined7 in_stack_ffffffffffffe730;
  undefined1 in_stack_ffffffffffffe737;
  undefined8 in_stack_ffffffffffffe738;
  undefined1 is_blind;
  Amount *in_stack_ffffffffffffe740;
  undefined7 in_stack_ffffffffffffe748;
  undefined1 in_stack_ffffffffffffe74f;
  UtxoData *in_stack_ffffffffffffe750;
  undefined7 in_stack_ffffffffffffe758;
  undefined1 in_stack_ffffffffffffe75f;
  UtxoData *in_stack_ffffffffffffe760;
  ElementsTransactionApi *in_stack_ffffffffffffe768;
  int in_stack_ffffffffffffe7a8;
  int in_stack_ffffffffffffe7b0;
  undefined6 in_stack_ffffffffffffe7b8;
  undefined1 in_stack_ffffffffffffe7be;
  undefined8 **local_1830;
  undefined8 **local_1810;
  AssertHelper local_17e0;
  Message local_17d8;
  undefined4 local_17cc;
  int64_t local_17c8;
  AssertionResult local_17c0;
  AssertHelper local_17b0;
  Message local_17a8;
  undefined4 local_179c;
  int64_t local_1798;
  AssertionResult local_1790;
  AssertHelper local_1780;
  Message local_1778;
  undefined4 local_176c;
  int64_t local_1768;
  AssertionResult local_1760;
  int64_t local_1750;
  undefined1 local_1748;
  string local_1740;
  int64_t local_1720;
  undefined1 local_1718;
  ElementsTransactionApi local_1709;
  Amount local_1708;
  Amount local_16f8;
  Amount local_16e8;
  undefined8 local_16d8;
  AssertHelper local_16d0;
  Message local_16c8 [2];
  undefined1 **local_16b8;
  undefined8 *local_16b0 [137];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffed98;
  ConfidentialTransactionContext *in_stack_ffffffffffffeda0;
  undefined1 **local_11c0;
  undefined8 local_11b8;
  AbstractTransaction local_1198 [12];
  undefined1 **local_10d8;
  undefined8 *local_10d0 [167];
  undefined1 **local_b98;
  undefined8 local_b90;
  allocator local_631;
  string local_630;
  ConfidentialAssetId local_610;
  Amount local_5e8;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_530;
  Txid local_508;
  undefined4 local_4e8;
  Script local_4e0 [8];
  string local_2f8 [32];
  int64_t local_2d8;
  undefined1 local_2d0;
  undefined4 local_2c8;
  undefined8 local_2c0;
  ConfidentialAssetId local_2b8 [16];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "02000000010141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff02016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000005e7f001600149aa483fc0fd0b1806f25e57903e4cbefb19c20a1016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f01000000000000002900000000000000000247304402204c761ad9b55f2fd502d09551656c34f5e118220c286072c7408fe1b2d9eb033202201cb5fbbd90038d82fd21b686a23fa26ac20574da7f28a2afff5e958547ab72ef012102026e4a89b56f6f89de4f0c00d084eacb9dc310e387433049b55d7737fa2e04a70608a85e000000000000206d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f206fe28c0ab6f1b372c1a6a246ae63f74f931e8365e15a089c68d6190000000000160014aab2ed7ac90f976a17ddb850c4a0c4e62db49b0753020000000123edd3be8309747693f42e5b6a0a0c57899fca7d6fb5a8d9c4f52fbf7398f03d00000000000000008001a85e00000000000017a914fdfbf873904e8276428aa892576acd028775fbda8700000000fdd9010400c0209ac0009d7289eb8e52ef1883501b35ec6ee8a5bfc83a09000000000000000000e157506b8e9b09bed1b9a9d6045fa26735547d696d9ce230c7f2003d09704594f558e160ce981317486c10c46e0600000c7eab9226e14b446023e58c32f677298a3a60448556b3b6dcf189ea680035de47fcd1a47ece1bda2de728f1ea7ca166338ddd0ab1ee2797c7cd2c9c5d5d07b055ed58f3b21f1324c98e1c09a8f4dd3a3f5b3a7ca8efc48fcbcb41cbf5476c40e9e3abc1c5d78e4b59dde0cfabf3c47d68f2f83893b19c0079b6902525c41e146ad09cb3859268063fd6e6b123036e6c65a975698553d701e04f0801752a4c454ff689b184b1c48c3fdfc33a7e25c2d96f8b9dfcbbb6b970f7da7ecbccd6f3d33141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b04b0b4b9206faf789f1c0659f100a69eea88bfdc66a2b2382fe628fb159304ffd3f7ef70acc4e0438b1fb380da205c7ae0746dfbb451bb2110a9a25e224455719c6c22fa85161cb1df6fc4a870b337d2de35c7cc478c6658147ea8e1d64e7152d172e425e8e3ffd1cfae750d09193292f6e170a1fbfd65d8d43ecc3c5e0932fddf4b338fb84ae565a87fb78bc9d4d5d32ab8bf1fba7880c08c3a8a3a7e3aa22803bdd60200000000"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffe750);
  local_530 = 0;
  local_2c0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"3b34ca92580075265d9548332041796ee7f55f63801835d3a4177f88601bfb41"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_508,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2e0924);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4e8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(local_4e0,&local_5b0);
  cfd::core::Script::~Script
            ((Script *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::__cxx11::string::operator=
            (local_2f8,"wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)");
  cfd::core::Amount::Amount(&local_5e8,0x5ea8);
  local_2d0 = local_5e8.ignore_check_;
  local_2d8 = local_5e8.amount_;
  local_2c8 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,"6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d"
             ,&local_631);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_610,&local_630);
  cfd::core::ConfidentialAssetId::operator=(local_2b8,&local_610);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2e0a92);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffe700);
  cfd::UtxoData::operator=
            ((UtxoData *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (UtxoData *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  local_10d8 = (undefined1 **)local_10d0;
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption
            (in_stack_ffffffffffffe710,in_stack_ffffffffffffe708);
  local_b98 = (undefined1 **)local_10d0;
  local_b90 = 1;
  std::allocator<cfd::api::ElementsUtxoAndOption>::allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2e0b22);
  __l._M_len._0_7_ = in_stack_ffffffffffffe730;
  __l._M_array = (iterator)in_stack_ffffffffffffe728;
  __l._M_len._7_1_ = in_stack_ffffffffffffe737;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)in_stack_ffffffffffffe720,__l,
         (allocator_type *)CONCAT17(in_stack_ffffffffffffe71f,in_stack_ffffffffffffe718));
  std::allocator<cfd::api::ElementsUtxoAndOption>::~allocator
            ((allocator<cfd::api::ElementsUtxoAndOption> *)0x2e0b56);
  local_1810 = &local_b98;
  do {
    local_1810 = local_1810 + -0xa7;
    cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
              ((ElementsUtxoAndOption *)
               CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  } while (local_1810 != local_10d0);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
             (string *)CONCAT44(in_stack_ffffffffffffe6ec,in_stack_ffffffffffffe6e8));
  local_16b8 = (undefined1 **)local_16b0;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffe760,
             (UtxoData *)CONCAT17(in_stack_ffffffffffffe75f,in_stack_ffffffffffffe758));
  local_11c0 = (undefined1 **)local_16b0;
  local_11b8 = 1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2e0c14);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe730;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe728;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe737;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffe720,__l_00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffe71f,in_stack_ffffffffffffe718));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2e0c48);
  local_1830 = &local_11c0;
  do {
    local_1830 = local_1830 + -0x9e;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
    is_blind = (undefined1)((ulong)in_stack_ffffffffffffe738 >> 0x38);
  } while (local_1830 != local_16b0);
  uVar1 = testing::internal::AlwaysTrue();
  if ((bool)uVar1) {
    in_stack_ffffffffffffe7be = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffe7be) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffeda0,in_stack_ffffffffffffed98);
    }
  }
  else {
    testing::Message::Message(local_16c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_16d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x654,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_16d0,local_16c8);
    testing::internal::AssertHelper::~AssertHelper(&local_16d0);
    testing::Message::~Message((Message *)0x2e115b);
  }
  local_16d8 = 0x3fb999999999999a;
  cfd::core::Amount::Amount(&local_16e8);
  cfd::core::Amount::Amount(&local_16f8);
  cfd::core::Amount::Amount(&local_1708);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_1709);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1740,local_1198);
  this_00 = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x0;
  uVar6 = 0;
  uVar5 = 0;
  AVar4 = cfd::api::ElementsTransactionApi::EstimateFee
                    (in_stack_ffffffffffffe768,(string *)in_stack_ffffffffffffe760,
                     (vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
                      *)CONCAT17(in_stack_ffffffffffffe75f,in_stack_ffffffffffffe758),
                     (ConfidentialAssetId *)in_stack_ffffffffffffe750,
                     (Amount *)CONCAT17(in_stack_ffffffffffffe74f,in_stack_ffffffffffffe748),
                     in_stack_ffffffffffffe740,(bool)is_blind,
                     (double)CONCAT17(in_stack_ffffffffffffe737,in_stack_ffffffffffffe730),
                     in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7b0,
                     (uint32_t *)
                     CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffe7be,in_stack_ffffffffffffe7b8)));
  local_1750 = AVar4.amount_;
  local_1748 = AVar4.ignore_check_;
  local_1720 = local_1750;
  local_1718 = local_1748;
  local_16e8.amount_ = local_1750;
  local_16e8.ignore_check_ = (bool)local_1748;
  std::__cxx11::string::~string((string *)&local_1740);
  local_1768 = cfd::core::Amount::GetSatoshiValue(&local_16e8);
  local_176c = 0x24;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe708,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe6fc,uVar6),
             (int *)CONCAT44(in_stack_ffffffffffffe6f4,uVar5));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1760);
  if (!bVar2) {
    testing::Message::Message(&local_1778);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2e13aa);
    testing::internal::AssertHelper::AssertHelper
              (&local_1780,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x65e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1780,&local_1778);
    testing::internal::AssertHelper::~AssertHelper(&local_1780);
    testing::Message::~Message((Message *)0x2e1407);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e145f);
  local_1798 = cfd::core::Amount::GetSatoshiValue(&local_1708);
  local_179c = 0xd;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe708,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe6fc,uVar6),
             (int *)CONCAT44(in_stack_ffffffffffffe6f4,uVar5));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1790);
  if (!bVar2) {
    testing::Message::Message(&local_17a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2e1521);
    testing::internal::AssertHelper::AssertHelper
              (&local_17b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x65f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_17b0,&local_17a8);
    testing::internal::AssertHelper::~AssertHelper(&local_17b0);
    testing::Message::~Message((Message *)0x2e157e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e15d6);
  local_17c8 = cfd::core::Amount::GetSatoshiValue(&local_16f8);
  local_17cc = 0x18;
  testing::internal::EqHelper<false>::Compare<long,int>
            ((char *)in_stack_ffffffffffffe708,(char *)this_00,
             (long *)CONCAT44(in_stack_ffffffffffffe6fc,uVar6),
             (int *)CONCAT44(in_stack_ffffffffffffe6f4,uVar5));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_17c0);
  if (!bVar2) {
    testing::Message::Message(&local_17d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2e1698);
    testing::internal::AssertHelper::AssertHelper
              (&local_17e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x660,pcVar3);
    testing::internal::AssertHelper::operator=(&local_17e0,&local_17d8);
    testing::internal::AssertHelper::~AssertHelper(&local_17e0);
    testing::Message::~Message((Message *)0x2e16f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e174a);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_00);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffe6f4,uVar5));
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_00);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption
            ((ElementsUtxoAndOption *)CONCAT44(in_stack_ffffffffffffe6f4,uVar5));
  cfd::UtxoData::~UtxoData((UtxoData *)CONCAT44(in_stack_ffffffffffffe6f4,uVar5));
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(ElementsTransactionApi, EstimateFee_PeginTx) {
  // signed pegin tx
  std::string pegin_tx_hex = "02000000010141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b0000004000ffffffff02016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f010000000000005e7f001600149aa483fc0fd0b1806f25e57903e4cbefb19c20a1016d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f01000000000000002900000000000000000247304402204c761ad9b55f2fd502d09551656c34f5e118220c286072c7408fe1b2d9eb033202201cb5fbbd90038d82fd21b686a23fa26ac20574da7f28a2afff5e958547ab72ef012102026e4a89b56f6f89de4f0c00d084eacb9dc310e387433049b55d7737fa2e04a70608a85e000000000000206d521c38ec1ea15734ae22b7c46064412829c0d0579f0a713d1c04ede979026f206fe28c0ab6f1b372c1a6a246ae63f74f931e8365e15a089c68d6190000000000160014aab2ed7ac90f976a17ddb850c4a0c4e62db49b0753020000000123edd3be8309747693f42e5b6a0a0c57899fca7d6fb5a8d9c4f52fbf7398f03d00000000000000008001a85e00000000000017a914fdfbf873904e8276428aa892576acd028775fbda8700000000fdd9010400c0209ac0009d7289eb8e52ef1883501b35ec6ee8a5bfc83a09000000000000000000e157506b8e9b09bed1b9a9d6045fa26735547d696d9ce230c7f2003d09704594f558e160ce981317486c10c46e0600000c7eab9226e14b446023e58c32f677298a3a60448556b3b6dcf189ea680035de47fcd1a47ece1bda2de728f1ea7ca166338ddd0ab1ee2797c7cd2c9c5d5d07b055ed58f3b21f1324c98e1c09a8f4dd3a3f5b3a7ca8efc48fcbcb41cbf5476c40e9e3abc1c5d78e4b59dde0cfabf3c47d68f2f83893b19c0079b6902525c41e146ad09cb3859268063fd6e6b123036e6c65a975698553d701e04f0801752a4c454ff689b184b1c48c3fdfc33a7e25c2d96f8b9dfcbbb6b970f7da7ecbccd6f3d33141fb1b60887f17a4d3351880635ff5e76e7941203348955d2675005892ca343b04b0b4b9206faf789f1c0659f100a69eea88bfdc66a2b2382fe628fb159304ffd3f7ef70acc4e0438b1fb380da205c7ae0746dfbb451bb2110a9a25e224455719c6c22fa85161cb1df6fc4a870b337d2de35c7cc478c6658147ea8e1d64e7152d172e425e8e3ffd1cfae750d09193292f6e170a1fbfd65d8d43ecc3c5e0932fddf4b338fb84ae565a87fb78bc9d4d5d32ab8bf1fba7880c08c3a8a3a7e3aa22803bdd60200000000";

  // Address1
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("3b34ca92580075265d9548332041796ee7f55f63801835d3a4177f88601bfb41");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0014eb3c0d55b7098a4aef4a18ee1eebcb1ed924a82b");
  utxo1.descriptor = "wpkh(03f942716865bb9b62678d99aa34de4632249d066d99de2b5a2e542e54908450d6)";
  utxo1.amount = Amount(int64_t{24232});
  utxo1.address_type = AddressType::kP2wpkhAddress;
  utxo1.asset = ConfidentialAssetId("6f0279e9ed041c3d710a9f57d0c02928416460c4b722ae3457a11eec381c526d");
  ElementsUtxoAndOption eutxo1;
  eutxo1.utxo = utxo1;
  std::vector<cfd::api::ElementsUtxoAndOption> utxos_and_options{
      eutxo1
  };

  ConfidentialTransactionContext txc(pegin_tx_hex);

  std::vector<cfd::UtxoData> utxos{utxo1};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  // check estimateFee
  double effective_fee_rate = 0.1;
  Amount calc_fee;
  Amount utxo_fee;
  Amount tx_fee;
  ElementsTransactionApi api;
  calc_fee = api.EstimateFee(txc.GetHex(), utxos_and_options, utxo1.asset,
      &tx_fee, &utxo_fee, false, effective_fee_rate, 0, 0);
  EXPECT_EQ(calc_fee.GetSatoshiValue(), 36);
  EXPECT_EQ(tx_fee.GetSatoshiValue(), 13);
  EXPECT_EQ(utxo_fee.GetSatoshiValue(), 24);
}